

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O1

from_chars_result __thiscall
semver::detail::range_parser::parse_range_comparator<int,int,int>
          (range_parser *this,
          vector<semver::detail::range_comparator<int,_int,_int>,_std::allocator<semver::detail::range_comparator<int,_int,_int>_>_>
          *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ptVar3;
  undefined8 uVar4;
  variant_alternative_t<3UL,_variant<monostate,_unsigned_char,_char,_range_operator>_> *pvVar5;
  size_t sVar6;
  char *pcVar7;
  pointer ptVar8;
  errc eVar9;
  from_chars_result fVar10;
  range_operator op;
  version_parser parser;
  token token;
  version<int,_int,_int> ver;
  range_operator local_b1;
  version_parser local_b0;
  undefined8 local_a8;
  char *local_a0;
  version<int,_int,_int> local_98;
  
  local_b1 = equal;
  local_a8._0_3_ = (uint3)(ushort)local_a8;
  sVar6 = (this->stream).current;
  ptVar3 = (this->stream).tokens.
           super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl
           .super__Vector_impl_data._M_start;
  ptVar8 = ptVar3 + sVar6;
  uVar4._0_1_ = ptVar8->type;
  uVar4._1_2_ = ptVar8->value;
  uVar4._3_5_ = *(undefined5 *)&ptVar8->field_0x3;
  if ((undefined1)uVar4 == '\a') {
    local_a0 = ptVar3[sVar6].lexeme;
    (this->stream).current = sVar6 + 1;
    local_a8 = uVar4;
    pvVar5 = std::get<3UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                         *)((long)&local_a8 + 1));
    local_b1 = *pvVar5;
  }
  sVar6 = (this->stream).current;
  ptVar8 = (this->stream).tokens.
           super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (ptVar8[sVar6].type == space) {
    ptVar8 = ptVar8 + sVar6;
    do {
      ptVar8 = ptVar8 + 1;
      sVar6 = sVar6 + 1;
      (this->stream).current = sVar6;
    } while (ptVar8->type == space);
  }
  paVar1 = &local_98.prerelease_tag_.field_2;
  local_98.major_ = 0;
  local_98.minor_ = 1;
  local_98.patch_ = 0;
  local_98.prerelease_tag_._M_string_length = 0;
  local_98.prerelease_tag_.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_98.build_metadata_.field_2;
  local_98.build_metadata_._M_string_length = 0;
  local_98.build_metadata_.field_2._M_local_buf[0] = '\0';
  local_98.prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0.stream = &this->stream;
  local_98.prerelease_tag_._M_dataplus._M_p = (pointer)paVar1;
  local_98.build_metadata_._M_dataplus._M_p = (pointer)paVar2;
  fVar10 = version_parser::parse<int,int,int>(&local_b0,&local_98);
  pcVar7 = fVar10.super_from_chars_result.ptr;
  eVar9 = fVar10.super_from_chars_result.ec;
  if (eVar9 == 0) {
    std::
    vector<semver::detail::range_comparator<int,int,int>,std::allocator<semver::detail::range_comparator<int,int,int>>>
    ::emplace_back<semver::version<int,int,int>&,semver::detail::range_operator&>
              ((vector<semver::detail::range_comparator<int,int,int>,std::allocator<semver::detail::range_comparator<int,int,int>>>
                *)out,&local_98,&local_b1);
    pcVar7 = (this->stream).tokens.
             super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
             _M_impl.super__Vector_impl_data._M_start[(this->stream).current].lexeme;
    eVar9 = 0;
  }
  std::
  vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ::~vector(&local_98.prerelease_identifiers);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.build_metadata_._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.build_metadata_._M_dataplus._M_p,
                    CONCAT71(local_98.build_metadata_.field_2._M_allocated_capacity._1_7_,
                             local_98.build_metadata_.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.prerelease_tag_._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.prerelease_tag_._M_dataplus._M_p,
                    CONCAT71(local_98.prerelease_tag_.field_2._M_allocated_capacity._1_7_,
                             local_98.prerelease_tag_.field_2._M_local_buf[0]) + 1);
  }
  fVar10.super_from_chars_result.ec = eVar9;
  fVar10.super_from_chars_result.ptr = pcVar7;
  fVar10.super_from_chars_result._12_4_ = 0;
  return (from_chars_result)fVar10.super_from_chars_result;
}

Assistant:

SEMVER_CONSTEXPR from_chars_result parse_range_comparator(std::vector<detail::range_comparator<I1, I2, I3>>& out) noexcept {
      range_operator op = range_operator::equal;
      token token;
      if (stream.advanceIfMatch(token, token_type::range_operator)) {
        op = std::get<range_operator>(token.value);
      }

      skip_whitespaces();

      version<I1, I2, I3> ver;
      version_parser parser{ stream };
      if (const auto res = parser.parse(ver); !res) {
        return res;
      }

      out.emplace_back(ver, op);
      return success(stream.peek().lexeme);
    }